

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_int_scalar_t<cfgfile::qstring_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::qstring_trait_t> *this,tag_t<cfgfile::qstring_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  byte in_CL;
  tag_scalar_t<int,_cfgfile::qstring_trait_t> *in_RDI;
  undefined1 in_stack_fffffffffffffedf;
  constraint_one_of_t<QString> *in_stack_fffffffffffffee0;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffee8;
  pos_t *value;
  tag_scalar_t<QString,_cfgfile::qstring_trait_t> *in_stack_fffffffffffffef0;
  constraint_one_of_t<QString> *this_00;
  pointer *ch;
  allocator<char> *__a;
  tag_scalar_t<int,_cfgfile::qstring_trait_t> *this_01;
  allocator<char> local_69;
  string local_68 [79];
  byte local_19;
  
  local_19 = in_CL & 1;
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::tag_scalar_t
            ((tag_scalar_t<int,_cfgfile::qstring_trait_t> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(string_t *)in_stack_fffffffffffffee0,
             (bool)in_stack_fffffffffffffedf);
  (in_RDI->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_int_scalar_t_00183ad8;
  this_01 = in_RDI + 1;
  cfgfile::constraint_one_of_t<int>::constraint_one_of_t
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffee0);
  ch = &in_RDI[1].super_tag_t<cfgfile::qstring_trait_t>.m_child_tags.
        super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __a = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)in_RDI,__a);
  cfgfile::qstring_trait_t::from_ascii((string *)in_RDI);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_t
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (string_t *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x143469);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  cfgfile::constraint_one_of_t<QString>::constraint_one_of_t(in_stack_fffffffffffffee0);
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8)
  ;
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8)
  ;
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8)
  ;
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::set_constraint
            (in_RDI,(constraint_t<int> *)(in_RDI + 1));
  QString::QString((QString *)__a,(char *)ch);
  cfgfile::constraint_one_of_t<QString>::add_value
            ((constraint_one_of_t<QString> *)in_stack_fffffffffffffef0,
             (QString *)in_stack_fffffffffffffee8);
  QString::~QString((QString *)0x14355e);
  this_00 = (constraint_one_of_t<QString> *)
            &in_RDI[2].super_tag_t<cfgfile::qstring_trait_t>.m_line_number;
  QString::QString((QString *)__a,(char *)ch);
  cfgfile::constraint_one_of_t<QString>::add_value(this_00,(QString *)in_stack_fffffffffffffee8);
  QString::~QString((QString *)0x1435a5);
  value = &in_RDI[2].super_tag_t<cfgfile::qstring_trait_t>.m_line_number;
  QString::QString((QString *)__a,(char *)ch);
  cfgfile::constraint_one_of_t<QString>::add_value(this_00,(QString *)value);
  QString::~QString((QString *)0x1435e3);
  QString::QString((QString *)__a,(char *)ch);
  cfgfile::constraint_one_of_t<QString>::add_value(this_00,(QString *)value);
  QString::~QString((QString *)0x143621);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::set_constraint
            ((tag_scalar_t<QString,_cfgfile::qstring_trait_t> *)
             &in_RDI[1].super_tag_t<cfgfile::qstring_trait_t>.m_child_tags.
              super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (constraint_t<QString> *)&in_RDI[2].super_tag_t<cfgfile::qstring_trait_t>.m_line_number
            );
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field_constraint.add_value( "one\n\"\r\t\\" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}